

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_stvewx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 EA;
  TCGv_ptr pTVar1;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  if (ctx->altivec_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    tcg_gen_andi_i64_ppc64(tcg_ctx,EA,EA,-4);
    pTVar1 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    local_28 = (TCGTemp *)(EA + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_stvewx_ppc64,(TCGTemp *)0x0,3,&local_38);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_mfvscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t;
    TCGv_i64 avr;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    avr = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_movi_i64(tcg_ctx, avr, 0);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, true);
    t = tcg_temp_new_i32(tcg_ctx);
    gen_helper_mfvscr(tcg_ctx, t, tcg_ctx->cpu_env);
    tcg_gen_extu_i32_i64(tcg_ctx, avr, t);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, false);
    tcg_temp_free_i32(tcg_ctx, t);
    tcg_temp_free_i64(tcg_ctx, avr);
}